

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenerator.hpp
# Opt level: O0

string * JSONFieldName(string *name)

{
  bool bVar1;
  reference pcVar2;
  char local_4a;
  char c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char itr;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  allocator local_1b;
  undefined1 local_1a;
  byte local_19;
  bool nextUppercase;
  string *name_local;
  string *result;
  
  local_19 = 0;
  local_1a = 0;
  name_local = name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)name,"",&local_1b);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffb8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_4a = *pcVar2;
    if (local_4a == '_') {
      local_19 = 1;
    }
    else {
      if ((((local_19 & 1) != 0) && ('`' < local_4a)) && (local_4a < '{')) {
        local_4a = local_4a + -0x20;
      }
      std::__cxx11::string::operator+=((string *)name,local_4a);
      local_19 = 0;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return name;
}

Assistant:

std::string JSONFieldName(const std::string &name) {
    bool nextUppercase = false;
    std::string result = "";
    for (auto itr : name) {
        if (itr == '_') {
            nextUppercase = true;
        } else {
            char c = itr;
            if (nextUppercase) {
                if ('a' <= c and c <= 'z') {
                    c += 'A' - 'a';
                }
            }

            result += c;
            nextUppercase = false;
        }
    }
    return result;
}